

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.c
# Opt level: O2

void write2Dfield(char *fileName,double **field,size_t sizeX,size_t sizeY,size_t offX,size_t offY,
                 char *mode)

{
  size_t __n;
  size_t sVar1;
  FILE *__s;
  ulong uVar2;
  size_t sizeY_local;
  size_t sizeX_local;
  
  sizeY_local = sizeY;
  sizeX_local = sizeX;
  if (field == (double **)0x0) {
    puts("The field is invalid.");
    return;
  }
  __s = fopen(fileName,mode);
  if (__s != (FILE *)0x0) {
    fwrite(&sizeX_local,8,1,__s);
    fwrite(&sizeY_local,8,1,__s);
    sVar1 = sizeX_local;
    __n = sizeY_local;
    for (uVar2 = 0; uVar2 < sVar1; uVar2 = uVar2 + 1) {
      fwrite(field[offX + uVar2] + offY,8,__n,__s);
    }
    fclose(__s);
    return;
  }
  printf("The file %s could not be opened.\n",fileName);
  return;
}

Assistant:

void write2Dfield (const char* fileName, REAL** field, size_t sizeX, size_t sizeY, size_t offX, size_t offY, const char *mode)
{
	if (field == NULL)
	{
		printf("The field is invalid.\n");
		return;
	}
	FILE *out = fopen(fileName,mode);
	if (out == NULL)
	{
		printf("The file %s could not be opened.\n",fileName);
		return;
	}
	fwrite(&sizeX,sizeof(size_t),1,out);
	fwrite(&sizeY,sizeof(size_t),1,out);
	for (size_t i = 0; i < sizeX; i++)
	{
		fwrite(field[i+offX]+offY,sizeof(REAL),sizeY,out);
	}
	fclose(out);
	return;
}